

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O2

QStringList * QGenericUnixTheme::themeNames(void)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  qsizetype qVar5;
  QList<QString> *in_RDI;
  QByteArray *desktopName;
  QByteArray *t;
  long lVar6;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView local_160;
  QLatin1String local_150;
  QLatin1String local_140;
  QArrayDataPointer<char> local_130;
  QArrayDataPointer<char> local_118;
  QArrayDataPointer<char> local_100;
  QArrayDataPointer<char> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<QByteArray> local_98;
  QArrayDataPointer<QByteArray> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  (in_RDI->d).size = 0;
  bVar1 = QGuiApplication::desktopSettingsAware();
  if (bVar1) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    iVar3 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x13])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x20))
              (&local_58,(long *)CONCAT44(extraout_var,iVar3));
    local_78.d = (Data *)0x0;
    local_78.ptr = (QByteArray *)0x0;
    local_78.size = 0;
    QByteArray::QByteArray((QByteArray *)&local_98,"GNOME",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)&local_78,(QByteArray *)&local_98);
    QByteArray::QByteArray((QByteArray *)&local_b8,"X-CINNAMON",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)&local_78,(QByteArray *)&local_b8);
    QByteArray::QByteArray((QByteArray *)&local_d0,"PANTHEON",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)&local_78,(QByteArray *)&local_d0);
    QByteArray::QByteArray((QByteArray *)&local_e8,"UNITY",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)&local_78,(QByteArray *)&local_e8);
    QByteArray::QByteArray((QByteArray *)&local_100,"MATE",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)&local_78,(QByteArray *)&local_100);
    QByteArray::QByteArray((QByteArray *)&local_118,"XFCE",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)&local_78,(QByteArray *)&local_118);
    QByteArray::QByteArray((QByteArray *)&local_130,"LXDE",-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)&local_78,(QByteArray *)&local_130);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_130);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_100);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d0);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_98);
    t = local_98.ptr;
    for (lVar6 = local_98.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
      local_b8.d = (Data *)0x61a3a3;
      bVar1 = ::operator==((QByteArray *)&local_58,(char **)&local_b8);
      if (bVar1) {
        QLatin1String::QLatin1String(&local_140,QKdeTheme::name);
        pcVar4 = local_140.m_data;
        qVar5 = local_140.m_size;
LAB_00587225:
        latin1.m_data = pcVar4;
        latin1.m_size = qVar5;
        QString::QString((QString *)&local_b8,latin1);
        QList<QString>::emplaceBack<QString>(in_RDI,(QString *)&local_b8);
      }
      else {
        bVar1 = QListSpecialMethodsBase<QByteArray>::contains<QByteArray>
                          ((QListSpecialMethodsBase<QByteArray> *)&local_78,t);
        if (bVar1) {
          local_d0.d = (Data *)0x0;
          local_d0.ptr = (char16_t *)0x0;
          local_b8.d = (Data *)0x0;
          local_b8.ptr = L"gtk3";
          local_d0.size = 0;
          local_b8.size = 4;
          QList<QString>::emplaceBack<QString>(in_RDI,(QString *)&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
          QLatin1String::QLatin1String(&local_150,QGnomeTheme::name);
          pcVar4 = local_150.m_data;
          qVar5 = local_150.m_size;
          goto LAB_00587225;
        }
        local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QByteArray::toLower_helper((QByteArray *)&local_d0);
        QString::fromLatin1<void>((QString *)&local_b8,(QByteArray *)&local_d0);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d0);
        cVar2 = QString::startsWith((QLatin1String *)&local_b8,2);
        if (cVar2 == '\0') {
          local_d0.d = local_b8.d;
          local_d0.ptr = local_b8.ptr;
          local_d0.size = local_b8.size;
          if (local_b8.d != (Data *)0x0) {
            LOCK();
            ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          QString::mid((longlong)&local_d0,(longlong)&local_b8);
        }
        QList<QString>::emplaceBack<QString>(in_RDI,(QString *)&local_d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      t = t + 1;
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  QLatin1String::QLatin1String(&local_160,name);
  QString::QString((QString *)&local_58,local_160);
  QList<QString>::emplaceBack<QString>(in_RDI,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QGenericUnixTheme::themeNames()
{
    QStringList result;
    if (QGuiApplication::desktopSettingsAware()) {
        const QByteArray desktopEnvironment = QGuiApplicationPrivate::platformIntegration()->services()->desktopEnvironment();
        QList<QByteArray> gtkBasedEnvironments;
        gtkBasedEnvironments << "GNOME"
                             << "X-CINNAMON"
                             << "PANTHEON"
                             << "UNITY"
                             << "MATE"
                             << "XFCE"
                             << "LXDE";
        const QList<QByteArray> desktopNames = desktopEnvironment.split(':');
        for (const QByteArray &desktopName : desktopNames) {
#if QT_CONFIG(dbus) && QT_CONFIG(settings) && (QT_CONFIG(xcb) || QT_CONFIG(wayland))
            if (desktopEnvironment == "KDE") {
                result.push_back(QLatin1StringView(QKdeTheme::name));
            } else
#endif
           if (gtkBasedEnvironments.contains(desktopName)) {
                // prefer the GTK3 theme implementation with native dialogs etc.
                result.push_back(QStringLiteral("gtk3"));
                // fallback to the generic Gnome theme if loading the GTK3 theme fails
                result.push_back(QLatin1StringView(QGnomeTheme::name));
            } else {
                // unknown, but lowercase the name (our standard practice) and
                // remove any "x-" prefix
                QString s = QString::fromLatin1(desktopName.toLower());
                result.push_back(s.startsWith("x-"_L1) ? s.mid(2) : s);
            }
        }
    } // desktopSettingsAware
    result.append(QLatin1StringView(QGenericUnixTheme::name));
    return result;
}